

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token.hpp
# Opt level: O0

bool isBuildInType(Token *token)

{
  code *pcVar1;
  bool bVar2;
  byte local_41;
  _Self local_38;
  _Self local_30;
  _Self local_28;
  _Self local_20;
  Token *local_18;
  Token *token_local;
  
  if (token->type == Name) {
    local_18 = token;
    local_20._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::find(&BuiltInTypes_abi_cxx11_,&token->source);
    local_28._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(&BuiltInTypes_abi_cxx11_);
    bVar2 = std::operator==(&local_20,&local_28);
    local_41 = 1;
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      local_30._M_node =
           (_Base_ptr)
           std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::find(&BuiltInClasses_abi_cxx11_,&token->source);
      local_38._M_node =
           (_Base_ptr)
           std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(&BuiltInClasses_abi_cxx11_);
      bVar2 = std::operator==(&local_30,&local_38);
      local_41 = bVar2 ^ 0xff;
    }
    if ((local_41 & 1) == 0) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    token_local._7_1_ = true;
  }
  else {
    token_local._7_1_ = false;
  }
  return token_local._7_1_;
}

Assistant:

bool isBuildInType(Token token) {
	if (token.type != Name) return false;
	if (BuiltInTypes.find(token.source) != BuiltInTypes.end() or
	    BuiltInClasses.find(token.source) != BuiltInClasses.end()) {
		return true;
	}
}